

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_removal_reason.cpp
# Opt level: O0

string * RemovalReasonToString_abi_cxx11_(MemPoolRemovalReason *r)

{
  allocator<char> *__a;
  uint *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *psVar1;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = (allocator<char> *)(ulong)*in_RSI;
  switch(__a) {
  case (allocator<char> *)0x0:
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar1,(char *)in_RSI,__a);
    std::allocator<char>::~allocator(&local_9);
    break;
  case (allocator<char> *)0x1:
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar1,(char *)in_RSI,__a);
    std::allocator<char>::~allocator(&local_a);
    break;
  case (allocator<char> *)0x2:
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar1,(char *)in_RSI,__a);
    std::allocator<char>::~allocator(&local_b);
    break;
  case (allocator<char> *)0x3:
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar1,(char *)in_RSI,__a);
    std::allocator<char>::~allocator(&local_c);
    break;
  case (allocator<char> *)0x4:
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar1,(char *)in_RSI,__a);
    std::allocator<char>::~allocator(&local_d);
    break;
  case (allocator<char> *)0x5:
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar1,(char *)in_RSI,__a);
    std::allocator<char>::~allocator(&local_e);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/mempool_removal_reason.cpp"
                  ,0x14,"std::string RemovalReasonToString(const MemPoolRemovalReason &)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string RemovalReasonToString(const MemPoolRemovalReason& r) noexcept
{
    switch (r) {
        case MemPoolRemovalReason::EXPIRY: return "expiry";
        case MemPoolRemovalReason::SIZELIMIT: return "sizelimit";
        case MemPoolRemovalReason::REORG: return "reorg";
        case MemPoolRemovalReason::BLOCK: return "block";
        case MemPoolRemovalReason::CONFLICT: return "conflict";
        case MemPoolRemovalReason::REPLACED: return "replaced";
    }
    assert(false);
}